

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::IterVar::fix_width(Var **var,uint32_t target_width)

{
  VarType VVar1;
  element_type *this;
  element_type *peVar2;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Var *local_68;
  Expr *expr;
  Param *c_1;
  Const *c;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  shared_ptr<kratos::VarCasted> casted;
  IterVar *iter;
  uint32_t target_width_local;
  Var **var_local;
  
  if ((*var == (Var *)0x0) || (VVar1 = Var::type(*var), VVar1 != Iter)) {
    if ((*var == (Var *)0x0) || (VVar1 = Var::type(*var), VVar1 != ConstValue)) {
      if ((*var == (Var *)0x0) || (VVar1 = Var::type(*var), VVar1 != Parameter)) {
        if ((*var == (Var *)0x0) || (VVar1 = Var::type(*var), VVar1 != Expression)) {
          if (*var != (Var *)0x0) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            (*((*var)->super_IRNode)._vptr_IRNode[0x20])(&local_a8);
            std::operator+(&local_88,"Unable to fix width for ",&local_a8);
            InternalException::InternalException(this_00,&local_88);
            __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
          }
        }
        else {
          local_68 = *var;
          fix_width((Var **)&local_68[1].super_IRNode.fn_name_ln,target_width);
          fix_width((Var **)&local_68[1].super_IRNode.fn_name_ln.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,target_width);
        }
      }
      else {
        expr = (Expr *)*var;
        Const::set_width((Const *)expr,target_width);
      }
    }
    else {
      c_1 = (Param *)*var;
      Const::set_width((Const *)c_1,target_width);
    }
  }
  else {
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*var;
    Var::cast((Var *)local_40,
              (VarCastType)
              casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi);
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_40);
    Var::as<kratos::VarCasted>((Var *)local_30);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_40);
    this = std::__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
    VarCasted::set_target_width(this,target_width);
    peVar2 = std::__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2> *)local_30);
    *var = &peVar2->super_Var;
    std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_30);
  }
  return;
}

Assistant:

void IterVar::fix_width(Var *&var, uint32_t target_width) {
    if (var && var->type() == VarType::Iter) {
        auto *iter = reinterpret_cast<IterVar *>(var);
        auto casted = iter->cast(VarCastType::Resize)->as<VarCasted>();
        casted->set_target_width(target_width);
        var = casted.get();
    } else if (var && var->type() == VarType::ConstValue) {
        auto *c = reinterpret_cast<Const *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Parameter) {
        auto *c = reinterpret_cast<Param *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Expression) {
        auto *expr = reinterpret_cast<Expr *>(var);
        fix_width(expr->left, target_width);
        fix_width(expr->right, target_width);
    } else {
        // LCOV_EXCL_START
        if (var) {
            throw InternalException("Unable to fix width for " + var->handle_name());
        }
        // LCOV_EXCL_STOP
    }
}